

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O1

void __thiscall GEO::LoggerStreamBuf::~LoggerStreamBuf(LoggerStreamBuf *this)

{
  *(code **)this = std::ios_base::Init::~Init;
  if (*(undefined1 **)&this->field_0x48 != &this->field_0x58) {
    operator_delete(*(undefined1 **)&this->field_0x48);
  }
  *(code **)this = sysconf;
  std::locale::~locale((locale *)&this->field_0x38);
  operator_delete(this);
  return;
}

Assistant:

class NO_GEOGRAM_API LoggerStreamBuf : public std::stringbuf {
    public:
        LoggerStreamBuf(LoggerStream* loggerStream) :
  	loggerStream_(loggerStream) {
        }

    private:
        int sync() override;

    private:
        LoggerStream* loggerStream_;
    }